

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O2

void __thiscall FNodeBuilder::AddSegs(FNodeBuilder *this,seg_t *segs,int numsegs)

{
  undefined8 *puVar1;
  double *pdVar2;
  long lVar3;
  FPrivVert *pFVar4;
  uint uVar5;
  long lVar6;
  FPrivSeg local_88;
  undefined8 local_40 [2];
  
  if (0 < numsegs) {
    for (lVar6 = 0; (ulong)(uint)numsegs * 0x48 - lVar6 != 0; lVar6 = lVar6 + 0x48) {
      local_88.next = 0xffffffff;
      local_88.loopnum = 0;
      local_88.partner = 0xffffffff;
      local_88.hashnext = (FPrivSeg *)0x0;
      local_88.planefront = false;
      local_88.storedseg = 0xffffffff;
      local_88.planenum = -1;
      puVar1 = (undefined8 *)((long)&segs->frontsector + lVar6);
      local_88.frontsector = (sector_t *)*puVar1;
      local_88.backsector = (sector_t *)puVar1[1];
      pdVar2 = *(double **)((long)&segs->v1 + lVar6);
      local_40[0] = CONCAT44(SUB84(pdVar2[1] + 103079215104.0,0),SUB84(*pdVar2 + 103079215104.0,0));
      local_88.v1 = (*this->VertexMap->_vptr_IVertexMap[2])(this->VertexMap,local_40);
      pdVar2 = *(double **)((long)&segs->v2 + lVar6);
      local_40[0] = CONCAT44(SUB84(pdVar2[1] + 103079215104.0,0),SUB84(*pdVar2 + 103079215104.0,0));
      local_88.v2 = (*this->VertexMap->_vptr_IVertexMap[2])(this->VertexMap,local_40);
      local_88.linedef =
           (int)((*(long *)((long)&segs->linedef + lVar6) - (long)this->Level->Lines) / 0x98);
      lVar3 = *(long *)((long)&segs->sidedef + lVar6);
      local_88.sidedef = -1;
      if (lVar3 != 0) {
        local_88.sidedef = (int)((lVar3 - (long)this->Level->Sides) / 0xd8);
      }
      pFVar4 = (this->Vertices).Array;
      local_88.nextforvert = pFVar4[local_88.v1].segs;
      local_88.nextforvert2 = pFVar4[local_88.v2].segs2;
      uVar5 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Push(&this->Segs,&local_88);
      pFVar4 = (this->Vertices).Array;
      pFVar4[local_88.v1].segs = uVar5;
      pFVar4[local_88.v2].segs2 = uVar5;
    }
    return;
  }
  __assert_fail("numsegs > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/nodebuild_utility.cpp"
                ,0xcf,"void FNodeBuilder::AddSegs(seg_t *, int)");
}

Assistant:

void FNodeBuilder::AddSegs(seg_t *segs, int numsegs)
{
	assert(numsegs > 0);

	for (int i = 0; i < numsegs; ++i)
	{
		FPrivSeg seg;
		FPrivVert vert;
		int segnum;

		seg.next = DWORD_MAX;
		seg.loopnum = 0;
		seg.partner = DWORD_MAX;
		seg.hashnext = NULL;
		seg.planefront = false;
		seg.planenum = DWORD_MAX;
		seg.storedseg = DWORD_MAX;

		seg.frontsector = segs[i].frontsector;
		seg.backsector = segs[i].backsector;
		vert.x = segs[i].v1->fixX();
		vert.y = segs[i].v1->fixY();
		seg.v1 = VertexMap->SelectVertexExact(vert);
		vert.x = segs[i].v2->fixX();
		vert.y = segs[i].v2->fixY();
		seg.v2 = VertexMap->SelectVertexExact(vert);
		seg.linedef = int(segs[i].linedef - Level.Lines);
		seg.sidedef = segs[i].sidedef != NULL ? int(segs[i].sidedef - Level.Sides) : int(NO_SIDE);
		seg.nextforvert = Vertices[seg.v1].segs;
		seg.nextforvert2 = Vertices[seg.v2].segs2;

		segnum = (int)Segs.Push(seg);
		Vertices[seg.v1].segs = segnum;
		Vertices[seg.v2].segs2 = segnum;
	}
}